

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

void ipc_pipe_nego_cb(void *arg)

{
  nni_aio *pnVar1;
  ipc_ep *ep;
  nng_err nVar2;
  size_t sVar3;
  ulong uVar4;
  nng_err result;
  undefined1 local_38 [8];
  nni_iov iov;
  
  ep = *(ipc_ep **)((long)arg + 0x20);
  nni_mtx_lock(&ep->mtx);
  nVar2 = NNG_ECLOSED;
  if (ep->closed == false) {
    pnVar1 = (nni_aio *)((long)arg + 0x438);
    nVar2 = nni_aio_result(pnVar1);
    if (nVar2 == NNG_OK) {
      uVar4 = *(ulong *)((long)arg + 0x58);
      if (uVar4 < *(ulong *)((long)arg + 0x68)) {
        sVar3 = nni_aio_count(pnVar1);
        uVar4 = sVar3 + *(long *)((long)arg + 0x58);
        *(ulong *)((long)arg + 0x58) = uVar4;
      }
      else if (*(ulong *)((long)arg + 0x60) < *(ulong *)((long)arg + 0x70)) {
        sVar3 = nni_aio_count(pnVar1);
        *(long *)((long)arg + 0x60) = *(long *)((long)arg + 0x60) + sVar3;
        uVar4 = *(ulong *)((long)arg + 0x58);
      }
      iov.iov_buf = (void *)(*(ulong *)((long)arg + 0x68) - uVar4);
      if (*(ulong *)((long)arg + 0x68) < uVar4 || iov.iov_buf == (void *)0x0) {
        uVar4 = *(ulong *)((long)arg + 0x60);
        iov.iov_buf = (void *)(*(ulong *)((long)arg + 0x70) - uVar4);
        if (*(ulong *)((long)arg + 0x70) < uVar4 || iov.iov_buf == (void *)0x0) {
          nVar2 = NNG_EPROTO;
          if ((((*(char *)((long)arg + 0x49) == '\0') && (*(char *)((long)arg + 0x4a) == 'S')) &&
              (*(char *)((long)arg + 0x4b) == 'P')) &&
             (((*(char *)((long)arg + 0x4c) == '\0' && (*(char *)((long)arg + 0x4f) == '\0')) &&
              (*(char *)((long)arg + 0x50) == '\0')))) {
            *(ushort *)((long)arg + 8) =
                 *(ushort *)((long)arg + 0x4d) << 8 | *(ushort *)((long)arg + 0x4d) >> 8;
            nni_list_remove(&ep->nego_pipes,arg);
            nni_list_append(&ep->wait_pipes,arg);
            ipc_ep_match(ep);
            nni_mtx_unlock(&ep->mtx);
            return;
          }
          goto LAB_00128404;
        }
        local_38 = (undefined1  [8])((long)arg + uVar4 + 0x49);
        nni_aio_set_iov(pnVar1,1,(nni_iov *)local_38);
        nng_stream_recv(*arg,pnVar1);
      }
      else {
        local_38 = (undefined1  [8])((long)arg + uVar4 + 0x40);
        nni_aio_set_iov(pnVar1,1,(nni_iov *)local_38);
        nng_stream_send(*arg,pnVar1);
      }
      nni_mtx_unlock(*(nni_mtx **)((long)arg + 0x20));
      return;
    }
  }
LAB_00128404:
  nni_list_remove(&ep->nego_pipes,arg);
  nng_stream_close(*arg);
  pnVar1 = ep->user_aio;
  if (pnVar1 != (nni_aio *)0x0) {
    result = NNG_ECONNSHUT;
    if (nVar2 != NNG_ECLOSED) {
      result = nVar2;
    }
    ep->user_aio = (nni_aio *)0x0;
    nni_aio_finish_error(pnVar1,result);
  }
  nni_mtx_unlock(&ep->mtx);
  nni_pipe_close(*(nni_pipe **)((long)arg + 0x28));
  nni_pipe_rele(*(nni_pipe **)((long)arg + 0x28));
  return;
}

Assistant:

static void
ipc_pipe_nego_cb(void *arg)
{
	ipc_pipe *p   = arg;
	ipc_ep   *ep  = p->ep;
	nni_aio  *aio = &p->neg_aio;
	nni_aio  *user_aio;
	int       rv;

	nni_mtx_lock(&ep->mtx);
	if (ep->closed) {
		rv = NNG_ECLOSED;
		goto error;
	}
	if ((rv = nni_aio_result(aio)) != 0) {
		goto error;
	}

	// We start transmitting before we receive.
	if (p->got_tx_head < p->want_tx_head) {
		p->got_tx_head += nni_aio_count(aio);
	} else if (p->got_rx_head < p->want_rx_head) {
		p->got_rx_head += nni_aio_count(aio);
	}
	if (p->got_tx_head < p->want_tx_head) {
		nni_iov iov;
		iov.iov_len = p->want_tx_head - p->got_tx_head;
		iov.iov_buf = &p->tx_head[p->got_tx_head];
		nni_aio_set_iov(aio, 1, &iov);
		// send it down...
		nng_stream_send(p->conn, aio);
		nni_mtx_unlock(&p->ep->mtx);
		return;
	}
	if (p->got_rx_head < p->want_rx_head) {
		nni_iov iov;
		iov.iov_len = p->want_rx_head - p->got_rx_head;
		iov.iov_buf = &p->rx_head[p->got_rx_head];
		nni_aio_set_iov(aio, 1, &iov);
		nng_stream_recv(p->conn, aio);
		nni_mtx_unlock(&p->ep->mtx);
		return;
	}
	// We have both sent and received the headers.  Let's check the
	// receiver.
	if ((p->rx_head[0] != 0) || (p->rx_head[1] != 'S') ||
	    (p->rx_head[2] != 'P') || (p->rx_head[3] != 0) ||
	    (p->rx_head[6] != 0) || (p->rx_head[7] != 0)) {
		rv = NNG_EPROTO;
		goto error;
	}

	NNI_GET16(&p->rx_head[4], p->peer);

	// We are ready now.  We put this in the wait list, and
	// then try to run the matcher.
	nni_list_remove(&ep->nego_pipes, p);
	nni_list_append(&ep->wait_pipes, p);

	ipc_ep_match(ep);
	nni_mtx_unlock(&ep->mtx);
	return;

error:
	// If the connection is closed, we need to pass back a different
	// error code.  This is necessary to avoid a problem where the
	// closed status is confused with the accept file descriptor
	// being closed.
	if (rv == NNG_ECLOSED) {
		rv = NNG_ECONNSHUT;
	}
	nni_list_remove(&ep->nego_pipes, p);
	nng_stream_close(p->conn);
	// If we are waiting to negotiate on a client side, then a failure
	// here has to be passed to the user app.
	if ((user_aio = ep->user_aio) != NULL) {
		ep->user_aio = NULL;
		nni_aio_finish_error(user_aio, rv);
	}
	nni_mtx_unlock(&ep->mtx);
	nni_pipe_close(p->pipe);
	nni_pipe_rele(p->pipe);
}